

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QHybrid.cpp
# Opt level: O0

void __thiscall QHybrid::ComputeWithCachedQValues(QHybrid *this)

{
  bool in_stack_000005cf;
  QHybrid *in_stack_000005d0;
  
  ComputeWithCachedQValues(in_stack_000005d0,in_stack_000005cf);
  return;
}

Assistant:

void QHybrid::ComputeWithCachedQValues(bool computeIfNotCached)
{
    string filenameCache=GetCacheFilename();

    // check whether both files exist
    bool cached=true;
    {
        stringstream ss;
        ss << filenameCache << "_firstTS";
        ifstream fp(ss.str().c_str());
        if(!fp)
            cached=false;
    }

    if(!cached && !computeIfNotCached)
    {
        stringstream ss;
        ss << "QHybrid::ComputeWithCachedQValues: Q function "
           << filenameCache << " not cached, bailing out";
        throw(E(ss.str()));
        return;
    }

    // Couldn't open cache file, so compute
    if(!cached)
    {
        Compute();
        Save(filenameCache);
    }
    else // load Q values from file
        Load(filenameCache);
}